

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * mg_get_response_code_text(mg_connection *conn,int response_code)

{
  char *pcVar1;
  uint in_ECX;
  uint line;
  char *in_RDX;
  uint uVar2;
  
  uVar2 = response_code - 400;
  if (uVar2 < 0x34) {
    line = (&switchD_0010c5ff::switchdataD_00128438)[uVar2] + 0x128438;
    switch(uVar2) {
    case 0:
      pcVar1 = "Bad Request";
      break;
    case 1:
      pcVar1 = "Unauthorized";
      break;
    case 2:
      pcVar1 = "Payment Required";
      break;
    case 3:
      pcVar1 = "Forbidden";
      break;
    case 4:
      pcVar1 = "Not Found";
      break;
    case 5:
      pcVar1 = "Method Not Allowed";
      break;
    case 6:
      pcVar1 = "Not Acceptable";
      break;
    case 7:
      pcVar1 = "Proxy Authentication Required";
      break;
    case 8:
      pcVar1 = "Request Time-out";
      break;
    case 9:
      pcVar1 = "Conflict";
      break;
    case 10:
      pcVar1 = "Gone";
      break;
    case 0xb:
      pcVar1 = "Length Required";
      break;
    case 0xc:
      pcVar1 = "Precondition Failed";
      break;
    case 0xd:
      pcVar1 = "Request Entity Too Large";
      break;
    case 0xe:
      pcVar1 = "Request-URI Too Large";
      break;
    case 0xf:
      pcVar1 = "Unsupported Media Type";
      break;
    case 0x10:
      pcVar1 = "Requested range not satisfiable";
      break;
    case 0x11:
      pcVar1 = "Expectation Failed";
      break;
    case 0x12:
      pcVar1 = "I am a teapot";
      break;
    case 0x13:
      pcVar1 = "Authentication Timeout";
      break;
    case 0x14:
      pcVar1 = "Enhance Your Calm";
      break;
    case 0x15:
      pcVar1 = "Misdirected Request";
      break;
    case 0x16:
      pcVar1 = "Unproccessable entity";
      break;
    case 0x17:
      pcVar1 = "Locked";
      break;
    case 0x18:
      pcVar1 = "Failed Dependency";
      break;
    default:
      goto switchD_0010c5e3_caseD_132;
    case 0x1a:
      pcVar1 = "Upgrade Required";
      break;
    case 0x1c:
      pcVar1 = "Precondition Required";
      break;
    case 0x1d:
      pcVar1 = "Too Many Requests";
      break;
    case 0x1f:
      pcVar1 = "Request Header Fields Too Large";
      break;
    case 0x28:
      pcVar1 = "Login Timeout";
      break;
    case 0x33:
      pcVar1 = "Unavailable For Legal Reasons";
    }
  }
  else {
    switch(response_code) {
    case 500:
      pcVar1 = "Internal Server Error";
      break;
    case 0x1f5:
      pcVar1 = "Not Implemented";
      break;
    case 0x1f6:
      pcVar1 = "Bad Gateway";
      break;
    case 0x1f7:
      pcVar1 = "Service Unavailable";
      break;
    case 0x1f8:
      pcVar1 = "Gateway Time-out";
      break;
    case 0x1f9:
      pcVar1 = "HTTP Version not supported";
      break;
    case 0x1fa:
      pcVar1 = "Variant Also Negotiates";
      break;
    case 0x1fb:
      pcVar1 = "Insufficient Storage";
      break;
    case 0x1fc:
      pcVar1 = "Loop Detected";
      break;
    case 0x1fd:
      pcVar1 = "Bandwidth Limit Exceeded";
      break;
    case 0x1fe:
      pcVar1 = "Not Extended";
      break;
    case 0x1ff:
      pcVar1 = "Network Authentication Required";
      break;
    default:
      switch(response_code) {
      case 200:
        pcVar1 = "OK";
        break;
      case 0xc9:
        pcVar1 = "Created";
        break;
      case 0xca:
        pcVar1 = "Accepted";
        break;
      case 0xcb:
        pcVar1 = "Non-Authoritative Information";
        break;
      case 0xcc:
        pcVar1 = "No Content";
        break;
      case 0xcd:
        pcVar1 = "Reset Content";
        break;
      case 0xce:
        pcVar1 = "Partial Content";
        break;
      case 0xcf:
        pcVar1 = "Multi-Status";
        break;
      case 0xd0:
        pcVar1 = "Already Reported";
        break;
      default:
        line = 0x128414;
        switch(response_code) {
        case 300:
          pcVar1 = "Multiple Choices";
          break;
        case 0x12d:
          pcVar1 = "Moved Permanently";
          break;
        case 0x12e:
          pcVar1 = "Found";
          break;
        case 0x12f:
          pcVar1 = "See Other";
          break;
        case 0x130:
          pcVar1 = "Not Modified";
          break;
        case 0x131:
          pcVar1 = "Use Proxy";
          break;
        case 0x133:
          pcVar1 = "Temporary Redirect";
          break;
        case 0x134:
          pcVar1 = "Permanent Redirect";
          break;
        default:
          if (response_code == 100) {
            return "Continue";
          }
          if (response_code == 0xe2) {
            return "IM used";
          }
          if (response_code == 0x66) {
            return "Processing";
          }
          line = in_ECX;
          if (response_code == 0x65) {
            return "Switching Protocols";
          }
        case 0x132:
switchD_0010c5e3_caseD_132:
          if (conn != (mg_connection *)0x0) {
            mg_cry_internal_wrap
                      (conn,(mg_context *)0x0,in_RDX,line,"Unknown HTTP response code: %u",
                       response_code);
          }
          if (response_code - 100U < 100) {
            pcVar1 = "Information";
          }
          else if (response_code - 200U < 100) {
            pcVar1 = "Success";
          }
          else if (response_code - 300U < 100) {
            pcVar1 = "Redirection";
          }
          else if (uVar2 < 100) {
            pcVar1 = "Client Error";
          }
          else {
            pcVar1 = "";
            if (response_code - 500U < 100) {
              pcVar1 = "Server Error";
            }
          }
        }
      }
    }
  }
  return pcVar1;
}

Assistant:

CIVETWEB_API const char *
mg_get_response_code_text(const struct mg_connection *conn, int response_code)
{
	/* See IANA HTTP status code assignment:
	 * http://www.iana.org/assignments/http-status-codes/http-status-codes.xhtml
	 */

	switch (response_code) {
		/* RFC2616 Section 10.1 - Informational 1xx */
	case 100:
		return "Continue"; /* RFC2616 Section 10.1.1 */
	case 101:
		return "Switching Protocols"; /* RFC2616 Section 10.1.2 */
	case 102:
		return "Processing"; /* RFC2518 Section 10.1 */

		/* RFC2616 Section 10.2 - Successful 2xx */
	case 200:
		return "OK"; /* RFC2616 Section 10.2.1 */
	case 201:
		return "Created"; /* RFC2616 Section 10.2.2 */
	case 202:
		return "Accepted"; /* RFC2616 Section 10.2.3 */
	case 203:
		return "Non-Authoritative Information"; /* RFC2616 Section 10.2.4 */
	case 204:
		return "No Content"; /* RFC2616 Section 10.2.5 */
	case 205:
		return "Reset Content"; /* RFC2616 Section 10.2.6 */
	case 206:
		return "Partial Content"; /* RFC2616 Section 10.2.7 */
	case 207:
		return "Multi-Status"; /* RFC2518 Section 10.2, RFC4918 Section 11.1
		                        */
	case 208:
		return "Already Reported"; /* RFC5842 Section 7.1 */

	case 226:
		return "IM used"; /* RFC3229 Section 10.4.1 */

		/* RFC2616 Section 10.3 - Redirection 3xx */
	case 300:
		return "Multiple Choices"; /* RFC2616 Section 10.3.1 */
	case 301:
		return "Moved Permanently"; /* RFC2616 Section 10.3.2 */
	case 302:
		return "Found"; /* RFC2616 Section 10.3.3 */
	case 303:
		return "See Other"; /* RFC2616 Section 10.3.4 */
	case 304:
		return "Not Modified"; /* RFC2616 Section 10.3.5 */
	case 305:
		return "Use Proxy"; /* RFC2616 Section 10.3.6 */
	case 307:
		return "Temporary Redirect"; /* RFC2616 Section 10.3.8 */
	case 308:
		return "Permanent Redirect"; /* RFC7238 Section 3 */

		/* RFC2616 Section 10.4 - Client Error 4xx */
	case 400:
		return "Bad Request"; /* RFC2616 Section 10.4.1 */
	case 401:
		return "Unauthorized"; /* RFC2616 Section 10.4.2 */
	case 402:
		return "Payment Required"; /* RFC2616 Section 10.4.3 */
	case 403:
		return "Forbidden"; /* RFC2616 Section 10.4.4 */
	case 404:
		return "Not Found"; /* RFC2616 Section 10.4.5 */
	case 405:
		return "Method Not Allowed"; /* RFC2616 Section 10.4.6 */
	case 406:
		return "Not Acceptable"; /* RFC2616 Section 10.4.7 */
	case 407:
		return "Proxy Authentication Required"; /* RFC2616 Section 10.4.8 */
	case 408:
		return "Request Time-out"; /* RFC2616 Section 10.4.9 */
	case 409:
		return "Conflict"; /* RFC2616 Section 10.4.10 */
	case 410:
		return "Gone"; /* RFC2616 Section 10.4.11 */
	case 411:
		return "Length Required"; /* RFC2616 Section 10.4.12 */
	case 412:
		return "Precondition Failed"; /* RFC2616 Section 10.4.13 */
	case 413:
		return "Request Entity Too Large"; /* RFC2616 Section 10.4.14 */
	case 414:
		return "Request-URI Too Large"; /* RFC2616 Section 10.4.15 */
	case 415:
		return "Unsupported Media Type"; /* RFC2616 Section 10.4.16 */
	case 416:
		return "Requested range not satisfiable"; /* RFC2616 Section 10.4.17
		                                           */
	case 417:
		return "Expectation Failed"; /* RFC2616 Section 10.4.18 */

	case 421:
		return "Misdirected Request"; /* RFC7540 Section 9.1.2 */
	case 422:
		return "Unproccessable entity"; /* RFC2518 Section 10.3, RFC4918
		                                 * Section 11.2 */
	case 423:
		return "Locked"; /* RFC2518 Section 10.4, RFC4918 Section 11.3 */
	case 424:
		return "Failed Dependency"; /* RFC2518 Section 10.5, RFC4918
		                             * Section 11.4 */

	case 426:
		return "Upgrade Required"; /* RFC 2817 Section 4 */

	case 428:
		return "Precondition Required"; /* RFC 6585, Section 3 */
	case 429:
		return "Too Many Requests"; /* RFC 6585, Section 4 */

	case 431:
		return "Request Header Fields Too Large"; /* RFC 6585, Section 5 */

	case 451:
		return "Unavailable For Legal Reasons"; /* draft-tbray-http-legally-restricted-status-05,
		                                         * Section 3 */

		/* RFC2616 Section 10.5 - Server Error 5xx */
	case 500:
		return "Internal Server Error"; /* RFC2616 Section 10.5.1 */
	case 501:
		return "Not Implemented"; /* RFC2616 Section 10.5.2 */
	case 502:
		return "Bad Gateway"; /* RFC2616 Section 10.5.3 */
	case 503:
		return "Service Unavailable"; /* RFC2616 Section 10.5.4 */
	case 504:
		return "Gateway Time-out"; /* RFC2616 Section 10.5.5 */
	case 505:
		return "HTTP Version not supported"; /* RFC2616 Section 10.5.6 */
	case 506:
		return "Variant Also Negotiates"; /* RFC 2295, Section 8.1 */
	case 507:
		return "Insufficient Storage"; /* RFC2518 Section 10.6, RFC4918
		                                * Section 11.5 */
	case 508:
		return "Loop Detected"; /* RFC5842 Section 7.1 */

	case 510:
		return "Not Extended"; /* RFC 2774, Section 7 */
	case 511:
		return "Network Authentication Required"; /* RFC 6585, Section 6 */

		/* Other status codes, not shown in the IANA HTTP status code
		 * assignment.
		 * E.g., "de facto" standards due to common use, ... */
	case 418:
		return "I am a teapot"; /* RFC2324 Section 2.3.2 */
	case 419:
		return "Authentication Timeout"; /* common use */
	case 420:
		return "Enhance Your Calm"; /* common use */
	case 440:
		return "Login Timeout"; /* common use */
	case 509:
		return "Bandwidth Limit Exceeded"; /* common use */

	default:
		/* This error code is unknown. This should not happen. */
		if (conn) {
			mg_cry_internal(conn,
			                "Unknown HTTP response code: %u",
			                response_code);
		}

		/* Return at least a category according to RFC 2616 Section 10. */
		if (response_code >= 100 && response_code < 200) {
			/* Unknown informational status code */
			return "Information";
		}
		if (response_code >= 200 && response_code < 300) {
			/* Unknown success code */
			return "Success";
		}
		if (response_code >= 300 && response_code < 400) {
			/* Unknown redirection code */
			return "Redirection";
		}
		if (response_code >= 400 && response_code < 500) {
			/* Unknown request error code */
			return "Client Error";
		}
		if (response_code >= 500 && response_code < 600) {
			/* Unknown server error code */
			return "Server Error";
		}

		/* Response code not even within reasonable range */
		return "";
	}
}